

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

uint32 * __thiscall Js::IndexPropertyDescriptorMap::CopyIndexList(IndexPropertyDescriptorMap *this)

{
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  uint *puVar2;
  Recycler *this_00;
  uint *puVar3;
  int i;
  long lVar4;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  pBVar1 = (this->indexPropertyMap).ptr;
  data.plusSize = (size_t)(pBVar1->count - pBVar1->freeCount);
  local_40 = (undefined1  [8])&unsigned_int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_9953769;
  data.filename._0_4_ = 0x1f;
  this_00 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_40);
  pBVar1 = (this->indexPropertyMap).ptr;
  puVar3 = Memory::AllocateArray<Memory::Recycler,unsigned_int,false>
                     ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeaf,0,
                      (long)(pBVar1->count - pBVar1->freeCount));
  pBVar1 = (this->indexPropertyMap).ptr;
  puVar2 = (this->indexList).ptr;
  for (lVar4 = 0; lVar4 < pBVar1->count - pBVar1->freeCount; lVar4 = lVar4 + 1) {
    puVar3[lVar4] = puVar2[lVar4];
  }
  return puVar3;
}

Assistant:

uint32 * IndexPropertyDescriptorMap::CopyIndexList() const
    {
        uint32 * newList = RecyclerNewArrayLeaf(recycler, uint32, Count());
        for (int i = 0; i < Count(); i++)
        {
            newList[i] = this->indexList[i];
        }
        return newList;
    }